

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O3

void handlePost(int argc,char **argv,Configuration *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  string name;
  string event;
  Q q;
  string command;
  Args args;
  string local_198;
  string local_178;
  string local_158;
  Q local_138;
  string local_f8;
  Args local_d8;
  
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._options._M_t._M_impl._0_8_ = 0;
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._optionCount._M_t._M_impl._0_8_ = 0;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._named._M_t._M_impl._0_8_ = 0;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._limit = -1;
  local_d8._negatives = false;
  local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._named._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Args::limitPositionals(&local_d8,3);
  Args::scan(&local_d8,argc,argv);
  iVar3 = Args::getPositionalCount(&local_d8);
  if (iVar3 == 1) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar5,"Queue name required.","");
    __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = Args::getPositionalCount(&local_d8);
  if (iVar3 == 2) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar5,"Event file required.","");
    __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Args::getPositional_abi_cxx11_(&local_f8,&local_d8,0);
  Args::getPositional_abi_cxx11_(&local_198,&local_d8,1);
  Args::getPositional_abi_cxx11_(&local_178,&local_d8,2);
  iVar3 = std::__cxx11::string::compare((char *)&local_198);
  if (iVar3 == 0) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar5,"Queue name required.","");
    __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_178);
  if (iVar3 != 0) {
    paVar1 = &local_138._name.field_2;
    local_138._name.field_2._M_allocated_capacity._0_4_ = 0x75657571;
    local_138._name.field_2._M_allocated_capacity._4_2_ = 0x65;
    local_138._name._M_string_length = 5;
    paVar2 = &local_138._location.field_2;
    local_138._location.field_2._M_allocated_capacity._0_2_ = 0x2e;
    local_138._location._M_string_length = 1;
    local_138._name._M_dataplus._M_p = (pointer)paVar1;
    local_138._location._M_dataplus._M_p = (pointer)paVar2;
    getQueueLocation(&local_158,config,&local_198);
    Q::create(&local_138,&local_198,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    Q::post(&local_138,&local_178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Central posted event to queue ",0x1e);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_198._M_dataplus._M_p,local_198._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._location._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._location._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8._positionals);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_d8._named._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_d8._optionCount._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)&local_d8);
    return;
  }
  psVar5 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar5 = psVar5 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar5,"Event file required.","");
  __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void handlePost (
  int argc,
  const char** argv,
  Configuration& config)
{
  // Process arguments;
  Args args;
  args.limitPositionals (3);         // post <name> <event>
  args.scan (argc, argv);

  if (args.getPositionalCount () == 1)
    throw std::string ("Queue name required.");

  else if (args.getPositionalCount () == 2)
    throw std::string ("Event file required.");

  auto command = args.getPositional (0);
  auto name    = args.getPositional (1);
  auto event   = args.getPositional (2);

  // Validate arguments.
  if (name == "")
    throw std::string ("Queue name required.");

  if (event == "")
    throw std::string ("Event file required.");

  Q q;
  q.create (name, getQueueLocation (config, name));
  q.post (event);

  std::cout << "Central posted event to queue "
            << name
            << ".\n";
}